

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
    *p = puVar1 + -1;
    puVar1[-1] = -(boolean != 0);
    iVar2 = mbedtls_asn1_write_len_and_tag(p,start,1,'\x01');
    return iVar2;
  }
  return -0x6c;
}

Assistant:

int mbedtls_asn1_write_bool(unsigned char **p, const unsigned char *start, int boolean)
{
    size_t len = 0;

    if (*p - start < 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    *--(*p) = (boolean) ? 255 : 0;
    len++;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BOOLEAN);
}